

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_SetMaxSendQueueSize(IOTHUB_MESSAGING_HANDLE messagingHandle,size_t maxQueueSize)

{
  LOGGER_LOG p_Var1;
  IOTHUB_MESSAGING_RESULT IVar2;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0 || maxQueueSize == 0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      IVar2 = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else {
      IVar2 = IOTHUB_MESSAGING_INVALID_ARG;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_SetMaxSendQueueSize",0x63d,1,
                "Invalid argument messagingHandle: %p maxQueueSize: %zu",messagingHandle,
                maxQueueSize);
    }
  }
  else {
    messagingHandle->max_send_queue_size = maxQueueSize;
    IVar2 = IOTHUB_MESSAGING_OK;
  }
  return IVar2;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_SetMaxSendQueueSize(IOTHUB_MESSAGING_HANDLE messagingHandle, size_t maxQueueSize)
{
    IOTHUB_MESSAGING_RESULT result;
    if (messagingHandle == NULL || maxQueueSize == 0)
    {
        LogError("Invalid argument messagingHandle: %p maxQueueSize: %zu", messagingHandle, maxQueueSize);
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else
    {
        messagingHandle->max_send_queue_size = maxQueueSize;
        result = IOTHUB_MESSAGING_OK;
    }

    return result;
}